

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void subclass_cb(Fl_Input *i,void *v)

{
  char *n;
  int iVar1;
  Fl_Widget_Type *t;
  Fl_Widget_Type *this;
  bool bVar2;
  
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar1 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      Fl_Input_::static_value(&i->super_Fl_Input_,current_widget->subclass_);
      return;
    }
    Fl_Widget::deactivate((Fl_Widget *)i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    n = (i->super_Fl_Input_).value_;
    bVar2 = true;
    this = (Fl_Widget_Type *)Fl_Type::first;
    do {
      while (((this->super_Fl_Type).selected != '\0' &&
             (iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar1 != 0))) {
        Fl_Widget_Type::subclass(this,n);
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
        bVar2 = false;
        if (this == (Fl_Widget_Type *)0x0) goto LAB_00185a8f;
      }
      this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Widget_Type *)0x0);
    if (!bVar2) {
LAB_00185a8f:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void subclass_cb(Fl_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->static_value(current_widget->subclass());
  } else {
    int mod = 0;
    const char *c = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type *t = (Fl_Widget_Type*)o;
	t->subclass(c);
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}